

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::MergeMeshes
               (aiMesh **_out,uint param_2,const_iterator begin,const_iterator end)

{
  aiVector3D *paVar1;
  const_iterator cVar2;
  bool bVar3;
  aiMesh *paVar4;
  reference ppaVar5;
  char *pcVar6;
  ulong uVar7;
  aiColor4D *paVar8;
  Logger *pLVar9;
  ulong *puVar10;
  aiFace *paVar11;
  aiFace *local_318;
  aiColor4t<float> *local_2d0;
  aiVector3t<float> *local_288;
  aiVector3t<float> *local_230;
  aiVector3t<float> *local_208;
  aiVector3t<float> *local_1c0;
  aiVector3t<float> *local_178;
  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> local_130;
  const_iterator it_7;
  uint local_114;
  uint q;
  aiFace *face;
  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> _Stack_100;
  uint m;
  const_iterator it_6;
  aiFace *paStack_f0;
  uint ofs;
  aiFace *pf2;
  const_iterator it_5;
  aiColor4D *pVec2;
  const_iterator it_4;
  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_> _Stack_c8;
  uint n;
  const_iterator it_3;
  aiVector3D *pv2b;
  const_iterator it_2;
  const_iterator it_1;
  aiVector3D *pv2;
  allocator<char> local_91;
  string local_90 [48];
  char *local_60;
  char *meshName;
  const_iterator it;
  string name;
  aiMesh *out;
  uint param_1_local;
  aiMesh **_out_local;
  const_iterator end_local;
  const_iterator begin_local;
  
  if (_out != (aiMesh **)0x0) {
    _out_local = end._M_current;
    end_local = begin;
    bVar3 = __gnu_cxx::operator==
                      (&end_local,
                       (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        *)&_out_local);
    if (bVar3) {
      *_out = (aiMesh *)0x0;
    }
    else {
      paVar4 = (aiMesh *)operator_new(0x520);
      aiMesh::aiMesh(paVar4);
      *_out = paVar4;
      ppaVar5 = __gnu_cxx::
                __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                ::operator*(&end_local);
      paVar4->mMaterialIndex = (*ppaVar5)->mMaterialIndex;
      std::__cxx11::string::string((string *)&it);
      meshName = (char *)end_local._M_current;
      while (bVar3 = __gnu_cxx::operator!=
                               ((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                 *)&meshName,
                                (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                 *)&_out_local), bVar3) {
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                               *)&meshName);
        pcVar6 = aiString::C_Str(&(*ppaVar5)->mName);
        local_60 = pcVar6;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_90,pcVar6,&local_91);
        std::__cxx11::string::operator+=((string *)&it,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        pv2 = (aiVector3D *)
              __gnu_cxx::
              __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
              ::operator-((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                           *)&_out_local,1);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                            *)&meshName,
                           (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                            *)&pv2);
        if (bVar3) {
          std::__cxx11::string::operator+=((string *)&it,".");
        }
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                               *)&meshName);
        paVar4->mNumVertices = (*ppaVar5)->mNumVertices + paVar4->mNumVertices;
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                               *)&meshName);
        paVar4->mNumFaces = (*ppaVar5)->mNumFaces + paVar4->mNumFaces;
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                               *)&meshName);
        paVar4->mNumBones = (*ppaVar5)->mNumBones + paVar4->mNumBones;
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                               *)&meshName);
        paVar4->mPrimitiveTypes = (*ppaVar5)->mPrimitiveTypes | paVar4->mPrimitiveTypes;
        __gnu_cxx::
        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
        operator++((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                    *)&meshName);
      }
      pcVar6 = (char *)std::__cxx11::string::c_str();
      aiString::Set(&paVar4->mName,pcVar6);
      if (paVar4->mNumVertices != 0) {
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*(&end_local);
        bVar3 = aiMesh::HasPositions(*ppaVar5);
        if (bVar3) {
          uVar7 = (ulong)paVar4->mNumVertices;
          it_1._M_current = (aiMesh **)operator_new__(uVar7 * 0xc);
          if (uVar7 != 0) {
            local_178 = (aiVector3t<float> *)it_1._M_current;
            do {
              aiVector3t<float>::aiVector3t(local_178);
              local_178 = local_178 + 1;
            } while (local_178 != (aiVector3D *)((long)it_1._M_current + uVar7 * 0xc));
          }
          paVar4->mVertices = (aiVector3D *)it_1._M_current;
          it_2 = end_local;
          while (bVar3 = __gnu_cxx::operator!=
                                   (&it_2,(__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                           *)&_out_local), bVar3) {
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*(&it_2);
            if ((*ppaVar5)->mVertices == (aiVector3D *)0x0) {
              pLVar9 = DefaultLogger::get();
              Logger::warn(pLVar9,
                           "JoinMeshes: Positions expected but input mesh contains no positions");
            }
            else {
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&it_2);
              paVar1 = (*ppaVar5)->mVertices;
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&it_2);
              memcpy(it_1._M_current,paVar1,(ulong)(*ppaVar5)->mNumVertices * 0xc);
            }
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*(&it_2);
            it_1._M_current = it_1._M_current + (ulong)(*ppaVar5)->mNumVertices * 0xc;
            __gnu_cxx::
            __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
            operator++(&it_2);
          }
        }
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*(&end_local);
        bVar3 = aiMesh::HasNormals(*ppaVar5);
        if (bVar3) {
          uVar7 = (ulong)paVar4->mNumVertices;
          it_1._M_current = (aiMesh **)operator_new__(uVar7 * 0xc);
          if (uVar7 != 0) {
            local_1c0 = (aiVector3t<float> *)it_1._M_current;
            do {
              aiVector3t<float>::aiVector3t(local_1c0);
              local_1c0 = local_1c0 + 1;
            } while (local_1c0 != (aiVector3D *)((long)it_1._M_current + uVar7 * 0xc));
          }
          paVar4->mNormals = (aiVector3D *)it_1._M_current;
          pv2b = (aiVector3D *)end_local._M_current;
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pv2b,(__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                              *)&_out_local), bVar3) {
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&pv2b);
            if ((*ppaVar5)->mNormals == (aiVector3D *)0x0) {
              pLVar9 = DefaultLogger::get();
              Logger::warn(pLVar9,"JoinMeshes: Normals expected but input mesh contains no normals")
              ;
            }
            else {
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pv2b);
              paVar1 = (*ppaVar5)->mNormals;
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pv2b);
              memcpy(it_1._M_current,paVar1,(ulong)(*ppaVar5)->mNumVertices * 0xc);
            }
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&pv2b);
            it_1._M_current = it_1._M_current + (ulong)(*ppaVar5)->mNumVertices * 0xc;
            __gnu_cxx::
            __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
            operator++((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        *)&pv2b);
          }
        }
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*(&end_local);
        bVar3 = aiMesh::HasTangentsAndBitangents(*ppaVar5);
        if (bVar3) {
          uVar7 = (ulong)paVar4->mNumVertices;
          it_1._M_current = (aiMesh **)operator_new__(uVar7 * 0xc);
          if (uVar7 != 0) {
            local_208 = (aiVector3t<float> *)it_1._M_current;
            do {
              aiVector3t<float>::aiVector3t(local_208);
              local_208 = local_208 + 1;
            } while (local_208 != (aiVector3D *)((long)it_1._M_current + uVar7 * 0xc));
          }
          paVar4->mTangents = (aiVector3D *)it_1._M_current;
          uVar7 = (ulong)paVar4->mNumVertices;
          it_3._M_current = (aiMesh **)operator_new__(uVar7 * 0xc);
          if (uVar7 != 0) {
            local_230 = (aiVector3t<float> *)it_3._M_current;
            do {
              aiVector3t<float>::aiVector3t(local_230);
              local_230 = local_230 + 1;
            } while (local_230 != (aiVector3D *)((long)it_3._M_current + uVar7 * 0xc));
          }
          paVar4->mBitangents = (aiVector3D *)it_3._M_current;
          _Stack_c8._M_current = end_local._M_current;
          while (bVar3 = __gnu_cxx::operator!=
                                   (&stack0xffffffffffffff38,
                                    (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&_out_local), bVar3) {
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*(&stack0xffffffffffffff38);
            if ((*ppaVar5)->mTangents == (aiVector3D *)0x0) {
              pLVar9 = DefaultLogger::get();
              Logger::warn(pLVar9,
                           "JoinMeshes: Tangents expected but input mesh contains no tangents");
            }
            else {
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&stack0xffffffffffffff38);
              paVar1 = (*ppaVar5)->mTangents;
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&stack0xffffffffffffff38);
              memcpy(it_1._M_current,paVar1,(ulong)(*ppaVar5)->mNumVertices * 0xc);
              cVar2 = it_3;
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&stack0xffffffffffffff38);
              paVar1 = (*ppaVar5)->mBitangents;
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&stack0xffffffffffffff38);
              memcpy(cVar2._M_current,paVar1,(ulong)(*ppaVar5)->mNumVertices * 0xc);
            }
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*(&stack0xffffffffffffff38);
            it_1._M_current = it_1._M_current + (ulong)(*ppaVar5)->mNumVertices * 0xc;
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*(&stack0xffffffffffffff38);
            it_3._M_current = it_3._M_current + (ulong)(*ppaVar5)->mNumVertices * 0xc;
            __gnu_cxx::
            __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
            operator++(&stack0xffffffffffffff38);
          }
        }
        it_4._M_current._4_4_ = 0;
        while( true ) {
          ppaVar5 = __gnu_cxx::
                    __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                    ::operator*(&end_local);
          bVar3 = aiMesh::HasTextureCoords(*ppaVar5,it_4._M_current._4_4_);
          if (!bVar3) break;
          ppaVar5 = __gnu_cxx::
                    __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                    ::operator*(&end_local);
          paVar4->mNumUVComponents[it_4._M_current._4_4_] =
               (*ppaVar5)->mNumUVComponents[it_4._M_current._4_4_];
          uVar7 = (ulong)paVar4->mNumVertices;
          it_1._M_current = (aiMesh **)operator_new__(uVar7 * 0xc);
          if (uVar7 != 0) {
            local_288 = (aiVector3t<float> *)it_1._M_current;
            do {
              aiVector3t<float>::aiVector3t(local_288);
              local_288 = local_288 + 1;
            } while (local_288 != (aiVector3D *)((long)it_1._M_current + uVar7 * 0xc));
          }
          paVar4->mTextureCoords[it_4._M_current._4_4_] = (aiVector3D *)it_1._M_current;
          pVec2 = (aiColor4D *)end_local._M_current;
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pVec2,
                                    (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&_out_local), bVar3) {
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&pVec2);
            if ((*ppaVar5)->mTextureCoords[it_4._M_current._4_4_] == (aiVector3D *)0x0) {
              pLVar9 = DefaultLogger::get();
              Logger::warn(pLVar9,"JoinMeshes: UVs expected but input mesh contains no UVs");
            }
            else {
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pVec2);
              paVar1 = (*ppaVar5)->mTextureCoords[it_4._M_current._4_4_];
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pVec2);
              memcpy(it_1._M_current,paVar1,(ulong)(*ppaVar5)->mNumVertices * 0xc);
            }
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&pVec2);
            it_1._M_current = it_1._M_current + (ulong)(*ppaVar5)->mNumVertices * 0xc;
            __gnu_cxx::
            __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
            operator++((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        *)&pVec2);
          }
          it_4._M_current._4_4_ = it_4._M_current._4_4_ + 1;
        }
        it_4._M_current._4_4_ = 0;
        while( true ) {
          ppaVar5 = __gnu_cxx::
                    __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                    ::operator*(&end_local);
          bVar3 = aiMesh::HasVertexColors(*ppaVar5,it_4._M_current._4_4_);
          if (!bVar3) break;
          uVar7 = (ulong)paVar4->mNumVertices;
          paVar8 = (aiColor4D *)operator_new__(uVar7 << 4);
          if (uVar7 != 0) {
            local_2d0 = paVar8;
            do {
              aiColor4t<float>::aiColor4t(local_2d0);
              local_2d0 = local_2d0 + 1;
            } while (local_2d0 != paVar8 + uVar7);
          }
          paVar4->mColors[it_4._M_current._4_4_] = paVar8;
          pf2 = (aiFace *)end_local._M_current;
          it_5._M_current = (aiMesh **)paVar8;
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pf2,(__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                             *)&_out_local), bVar3) {
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&pf2);
            cVar2 = it_5;
            if ((*ppaVar5)->mColors[it_4._M_current._4_4_] == (aiColor4D *)0x0) {
              pLVar9 = DefaultLogger::get();
              Logger::warn(pLVar9,"JoinMeshes: VCs expected but input mesh contains no VCs");
            }
            else {
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pf2);
              paVar8 = (*ppaVar5)->mColors[it_4._M_current._4_4_];
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                     *)&pf2);
              memcpy(cVar2._M_current,paVar8,(ulong)(*ppaVar5)->mNumVertices << 4);
            }
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&pf2);
            it_5._M_current = it_5._M_current + (ulong)(*ppaVar5)->mNumVertices * 2;
            __gnu_cxx::
            __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
            operator++((__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        *)&pf2);
          }
          it_4._M_current._4_4_ = it_4._M_current._4_4_ + 1;
        }
      }
      if (paVar4->mNumFaces != 0) {
        uVar7 = (ulong)paVar4->mNumFaces;
        puVar10 = (ulong *)operator_new__(uVar7 << 4 | 8);
        *puVar10 = uVar7;
        paVar11 = (aiFace *)(puVar10 + 1);
        if (uVar7 != 0) {
          local_318 = paVar11;
          do {
            aiFace::aiFace(local_318);
            local_318 = local_318 + 1;
          } while (local_318 != paVar11 + uVar7);
        }
        paVar4->mFaces = paVar11;
        paStack_f0 = paVar4->mFaces;
        it_6._M_current._4_4_ = 0;
        _Stack_100._M_current = end_local._M_current;
        while (bVar3 = __gnu_cxx::operator!=
                                 (&stack0xffffffffffffff00,
                                  (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                   *)&_out_local), bVar3) {
          for (face._4_4_ = 0;
              ppaVar5 = __gnu_cxx::
                        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                        ::operator*(&stack0xffffffffffffff00), face._4_4_ < (*ppaVar5)->mNumFaces;
              face._4_4_ = face._4_4_ + 1) {
            ppaVar5 = __gnu_cxx::
                      __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                      ::operator*(&stack0xffffffffffffff00);
            paVar11 = (*ppaVar5)->mFaces + face._4_4_;
            paStack_f0->mNumIndices = paVar11->mNumIndices;
            paStack_f0->mIndices = paVar11->mIndices;
            if (it_6._M_current._4_4_ != 0) {
              for (local_114 = 0; local_114 < paVar11->mNumIndices; local_114 = local_114 + 1) {
                paVar11->mIndices[local_114] = it_6._M_current._4_4_ + paVar11->mIndices[local_114];
              }
            }
            paVar11->mIndices = (uint *)0x0;
            paStack_f0 = paStack_f0 + 1;
          }
          ppaVar5 = __gnu_cxx::
                    __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                    ::operator*(&stack0xffffffffffffff00);
          it_6._M_current._4_4_ = (*ppaVar5)->mNumVertices + it_6._M_current._4_4_;
          __gnu_cxx::
          __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
          operator++(&stack0xffffffffffffff00);
        }
      }
      if (paVar4->mNumBones != 0) {
        it_7._M_current = _out_local;
        MergeBones(paVar4,end_local,(const_iterator)_out_local);
      }
      local_130._M_current = end_local._M_current;
      while (bVar3 = __gnu_cxx::operator!=
                               (&local_130,
                                (__normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                                 *)&_out_local), bVar3) {
        ppaVar5 = __gnu_cxx::
                  __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>
                  ::operator*(&local_130);
        paVar4 = *ppaVar5;
        if (paVar4 != (aiMesh *)0x0) {
          aiMesh::~aiMesh(paVar4);
          operator_delete(paVar4,0x520);
        }
        __gnu_cxx::
        __normal_iterator<aiMesh_*const_*,_std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>_>::
        operator++(&local_130);
      }
      std::__cxx11::string::~string((string *)&it);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeMeshes(aiMesh** _out, unsigned int /*flags*/,
    std::vector<aiMesh*>::const_iterator begin,
    std::vector<aiMesh*>::const_iterator end)
{
    if ( nullptr == _out ) {
        return;
    }

    if (begin == end)   {
        *_out = NULL; // no meshes ...
        return;
    }

    // Allocate the output mesh
    aiMesh* out = *_out = new aiMesh();
    out->mMaterialIndex = (*begin)->mMaterialIndex;

    std::string name;
    // Find out how much output storage we'll need
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it) {
        const char *meshName( (*it)->mName.C_Str() );
        name += std::string( meshName );
        if ( it != end - 1 ) {
            name += ".";
        }
        out->mNumVertices   += (*it)->mNumVertices;
        out->mNumFaces      += (*it)->mNumFaces;
        out->mNumBones      += (*it)->mNumBones;

        // combine primitive type flags
        out->mPrimitiveTypes |= (*it)->mPrimitiveTypes;
    }
    out->mName.Set( name.c_str() );

    if (out->mNumVertices) {
        aiVector3D* pv2;

        // copy vertex positions
        if ((**begin).HasPositions())   {

            pv2 = out->mVertices = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it)  {
                if ((*it)->mVertices)   {
                    ::memcpy(pv2,(*it)->mVertices,(*it)->mNumVertices*sizeof(aiVector3D));
                }
                else ASSIMP_LOG_WARN("JoinMeshes: Positions expected but input mesh contains no positions");
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy normals
        if ((**begin).HasNormals()) {

            pv2 = out->mNormals = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mNormals)    {
                    ::memcpy(pv2,(*it)->mNormals,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Normals expected but input mesh contains no normals" );
                }
                pv2 += (*it)->mNumVertices;
            }
        }
        // copy tangents and bi-tangents
        if ((**begin).HasTangentsAndBitangents())   {

            pv2 = out->mTangents = new aiVector3D[out->mNumVertices];
            aiVector3D* pv2b = out->mBitangents = new aiVector3D[out->mNumVertices];

            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it) {
                if ((*it)->mTangents)   {
                    ::memcpy(pv2, (*it)->mTangents,  (*it)->mNumVertices*sizeof(aiVector3D));
                    ::memcpy(pv2b,(*it)->mBitangents,(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: Tangents expected but input mesh contains no tangents" );
                }
                pv2  += (*it)->mNumVertices;
                pv2b += (*it)->mNumVertices;
            }
        }
        // copy texture coordinates
        unsigned int n = 0;
        while ((**begin).HasTextureCoords(n)) {
            out->mNumUVComponents[n] = (*begin)->mNumUVComponents[n];

            pv2 = out->mTextureCoords[n] = new aiVector3D[out->mNumVertices];
            for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
                if ((*it)->mTextureCoords[n])   {
                    ::memcpy(pv2,(*it)->mTextureCoords[n],(*it)->mNumVertices*sizeof(aiVector3D));
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: UVs expected but input mesh contains no UVs" );
                }
                pv2 += (*it)->mNumVertices;
            }
            ++n;
        }
        // copy vertex colors
        n = 0;
        while ((**begin).HasVertexColors(n))    {
            aiColor4D *pVec2 = out->mColors[n] = new aiColor4D[out->mNumVertices];
            for ( std::vector<aiMesh*>::const_iterator it = begin; it != end; ++it )   {
                if ((*it)->mColors[n])  {
                    ::memcpy( pVec2, (*it)->mColors[ n ], (*it)->mNumVertices * sizeof( aiColor4D ) ) ;
                } else {
                    ASSIMP_LOG_WARN( "JoinMeshes: VCs expected but input mesh contains no VCs" );
                }
                pVec2 += (*it)->mNumVertices;
            }
            ++n;
        }
    }

    if (out->mNumFaces) // just for safety
    {
        // copy faces
        out->mFaces = new aiFace[out->mNumFaces];
        aiFace* pf2 = out->mFaces;

        unsigned int ofs = 0;
        for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)   {
            for (unsigned int m = 0; m < (*it)->mNumFaces;++m,++pf2)    {
                aiFace& face = (*it)->mFaces[m];
                pf2->mNumIndices = face.mNumIndices;
                pf2->mIndices = face.mIndices;

                if (ofs)    {
                    // add the offset to the vertex
                    for (unsigned int q = 0; q < face.mNumIndices; ++q)
                        face.mIndices[q] += ofs;
                }
                face.mIndices = NULL;
            }
            ofs += (*it)->mNumVertices;
        }
    }

    // bones - as this is quite lengthy, I moved the code to a separate function
    if (out->mNumBones)
        MergeBones(out,begin,end);

    // delete all source meshes
    for (std::vector<aiMesh*>::const_iterator it = begin; it != end;++it)
        delete *it;
}